

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_scan.hpp
# Opt level: O0

void __thiscall
duckdb::AlpRDScanState<double>::LoadVector<true>
          (AlpRDScanState<double> *this,EXACT_TYPE *value_buffer)

{
  unsigned_short uVar1;
  uint uVar2;
  unsigned_long count;
  const_data_ptr_t pdVar3;
  idx_t __n;
  idx_t __n_00;
  EXACT_TYPE *in_RSI;
  idx_t in_RDI;
  idx_t right_bp_size;
  idx_t left_bp_size;
  data_ptr_t vector_ptr;
  idx_t vector_size;
  uint data_byte_offset;
  bitpacking_width_t in_stack_ffffffffffffffbf;
  
  AlpRDVectorState<double>::Reset((AlpRDVectorState<double> *)(in_RDI + 0x38));
  *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + -4;
  uVar2 = Load<unsigned_int>(*(const_data_ptr_t *)(in_RDI + 0x20));
  count = MinValue<unsigned_long>(0x400,*(long *)(in_RDI + 0x7060) - *(long *)(in_RDI + 0x30));
  pdVar3 = (const_data_ptr_t)(*(long *)(in_RDI + 0x28) + (ulong)uVar2);
  uVar1 = Load<unsigned_short>(pdVar3);
  *(unsigned_short *)(in_RDI + 0x7040) = uVar1;
  pdVar3 = pdVar3 + 2;
  __n = BitpackingPrimitives::GetRequiredSize(in_RDI,in_stack_ffffffffffffffbf);
  __n_00 = BitpackingPrimitives::GetRequiredSize(in_RDI,in_stack_ffffffffffffffbf);
  memcpy((void *)(in_RDI + 0x40),pdVar3,__n);
  pdVar3 = pdVar3 + __n;
  memcpy((void *)(in_RDI + 0x2040),pdVar3,__n_00);
  if (*(short *)(in_RDI + 0x7040) != 0) {
    memcpy((void *)(in_RDI + 0x6040),pdVar3 + __n_00,
           (long)(int)((uint)*(ushort *)(in_RDI + 0x7040) << 1));
    memcpy((void *)(in_RDI + 0x6840),
           pdVar3 + __n_00 + (int)((uint)*(ushort *)(in_RDI + 0x7040) << 1),
           (long)(int)((uint)*(ushort *)(in_RDI + 0x7040) << 1));
  }
  AlpRDVectorState<double>::LoadValues<true>
            ((AlpRDVectorState<double> *)(in_RDI + 0x38),in_RSI,count);
  return;
}

Assistant:

void LoadVector(EXACT_TYPE *value_buffer) {
		vector_state.Reset();

		// Load the offset (metadata) indicating where the vector data starts
		metadata_ptr -= AlpRDConstants::METADATA_POINTER_SIZE;
		auto data_byte_offset = Load<uint32_t>(metadata_ptr);
		D_ASSERT(data_byte_offset < segment.GetBlockManager().GetBlockSize());

		idx_t vector_size = MinValue((idx_t)AlpRDConstants::ALP_VECTOR_SIZE, (count - total_value_count));

		data_ptr_t vector_ptr = segment_data + data_byte_offset;

		// Load the vector data
		vector_state.exceptions_count = Load<uint16_t>(vector_ptr);
		vector_ptr += AlpRDConstants::EXCEPTIONS_COUNT_SIZE;
		D_ASSERT(vector_state.exceptions_count <= vector_size);

		auto left_bp_size = BitpackingPrimitives::GetRequiredSize(vector_size, vector_state.left_bit_width);
		auto right_bp_size = BitpackingPrimitives::GetRequiredSize(vector_size, vector_state.right_bit_width);

		memcpy(vector_state.left_encoded, (void *)vector_ptr, left_bp_size);
		vector_ptr += left_bp_size;

		memcpy(vector_state.right_encoded, (void *)vector_ptr, right_bp_size);
		vector_ptr += right_bp_size;

		if (vector_state.exceptions_count > 0) {
			memcpy(vector_state.exceptions, (void *)vector_ptr,
			       AlpRDConstants::EXCEPTION_SIZE * vector_state.exceptions_count);
			vector_ptr += AlpRDConstants::EXCEPTION_SIZE * vector_state.exceptions_count;
			memcpy(vector_state.exceptions_positions, (void *)vector_ptr,
			       AlpRDConstants::EXCEPTION_POSITION_SIZE * vector_state.exceptions_count);
		}

		// Decode all the vector values to the specified 'value_buffer'
		vector_state.template LoadValues<SKIP>(value_buffer, vector_size);
	}